

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ontrak.cpp
# Opt level: O1

int SetDefaultDevicesState(void)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  iVar1 = SetRelayOntrak(&ontrak,0,1);
  if (iVar1 == 0) {
    bArmadeusON = 1;
    iVar2 = 1;
    iVar1 = SetDeviceCurrentState("CurArmadeusState.txt",1);
    if (iVar1 == 0) {
      iVar2 = 1;
      iVar1 = SetRelayOntrak(&ontrak,1,1);
      if (iVar1 == 0) {
        bBottomPumpON = 0;
        iVar1 = SetDeviceCurrentState("CurBottomPumpState.txt",0);
        if (iVar1 == 0) {
          iVar2 = 1;
          iVar1 = SetRelayOntrak(&ontrak,2,1);
          if (iVar1 == 0) {
            bSurfacePumpON = 0;
            iVar1 = SetDeviceCurrentState("CurSurfacePumpState.txt",0);
            if (iVar1 == 0) {
              iVar1 = SetRelayOntrak(&ontrak,4,0);
              if (iVar1 == 0) {
                bProbeON = 1;
                iVar2 = 1;
                iVar1 = SetDeviceCurrentState("CurProbeState.txt",1);
                if (iVar1 == 0) {
                  iVar2 = 1;
                  iVar1 = SetRelayOntrak(&ontrak,3,1);
                  if (iVar1 == 0) {
                    bWifiON = 1;
                    iVar2 = 1;
                    iVar1 = SetDeviceCurrentState("CurWifiState.txt",1);
                    if (iVar1 == 0) {
                      iVar1 = SetDigitalRelayOntrak(&ontrak,6,0);
                      if (iVar1 == 0) {
                        bIridiumON = 1;
                        iVar2 = 1;
                        iVar1 = SetDeviceCurrentState("CurIridiumState.txt",1);
                        if (iVar1 == 0) {
                          iVar1 = SetDigitalRelayOntrak(&ontrak,7,0);
                          if (iVar1 == 0) {
                            bSailMotorON = 1;
                            iVar2 = 1;
                            iVar1 = SetDeviceCurrentState("CurSailMotorState.txt",1);
                            if (iVar1 == 0) {
                              puts("Devices default state : ");
                              puts("   Armadeus : ON");
                              puts("   Bottom pump : OFF");
                              puts("   Surface pump : OFF");
                              puts("   Probe : ON");
                              puts("   Wi-Fi : ON");
                              puts("   Iridium : ON");
                              puts("   Sail motor : ON");
                              fflush(_stdout);
                              iVar2 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int SetDefaultDevicesState(void)
{
	// Switch on the Armadeus (active-low).
	if (SetRelayOntrak(&ontrak, ARMADEUS_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bArmadeusON = 1;
	if (SetDeviceCurrentState("CurArmadeusState.txt", bArmadeusON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch off the bottom pump.
	if (SetRelayOntrak(&ontrak, BOTTOM_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bBottomPumpON = 0;
	if (SetDeviceCurrentState("CurBottomPumpState.txt", bBottomPumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch off the surface pump.
	if (SetRelayOntrak(&ontrak, SURFACE_PUMP_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bSurfacePumpON = 0;
	if (SetDeviceCurrentState("CurSurfacePumpState.txt", bSurfacePumpON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch on the probe.
	if (SetRelayOntrak(&ontrak, PROBE_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bProbeON = 1;
	if (SetDeviceCurrentState("CurProbeState.txt", bProbeON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch on the Wi-Fi (active-low).
	if (SetRelayOntrak(&ontrak, WIFI_CHANNEL_ONTRAK, 1) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bWifiON = 1;
	if (SetDeviceCurrentState("CurWifiState.txt", bWifiON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch on the Iridium.
	if (SetDigitalRelayOntrak(&ontrak, IRIDIUM_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bIridiumON = 1;
	if (SetDeviceCurrentState("CurIridiumState.txt", bIridiumON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	// Switch on the sail motor.
	if (SetDigitalRelayOntrak(&ontrak, SAIL_MOTOR_CHANNEL_ONTRAK, 0) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	bSailMotorON = 1;
	if (SetDeviceCurrentState("CurSailMotorState.txt", bSailMotorON) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	printf("Devices default state : \n");
	printf("   Armadeus : ON\n");
	printf("   Bottom pump : OFF\n");
	printf("   Surface pump : OFF\n");
	printf("   Probe : ON\n");
	printf("   Wi-Fi : ON\n");
	printf("   Iridium : ON\n");
	printf("   Sail motor : ON\n");
	fflush(stdout);

	return EXIT_SUCCESS;
}